

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void delete_reopen_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  fdb_config *__ptr;
  size_t metalen;
  size_t bodylen;
  fdb_config *pfVar4;
  uint uVar5;
  ulong unaff_RBP;
  char *pcVar6;
  fdb_doc *pfVar7;
  fdb_file_handle **ptr_fhandle;
  ulong uVar8;
  fdb_doc *unaff_R14;
  char *kvs_config;
  fdb_file_handle *fh;
  fdb_kvs_handle *db;
  size_t valueSize;
  void *value;
  timeval __test_begin;
  fdb_doc *pfStack_1428;
  fdb_kvs_handle *pfStack_1420;
  fdb_file_handle *pfStack_1418;
  timeval tStack_1410;
  fdb_kvs_config fStack_1400;
  fdb_config fStack_13e8;
  char acStack_12f0 [256];
  char *pcStack_11f0;
  fdb_config *pfStack_11e8;
  fdb_config *pfStack_11e0;
  fdb_file_handle *pfStack_11d0;
  fdb_kvs_handle *pfStack_11c8;
  fdb_kvs_config fStack_11c0;
  timeval tStack_11a8;
  char acStack_1198 [264];
  fdb_config fStack_1090;
  char acStack_f98 [256];
  char acStack_e98 [264];
  char *pcStack_d90;
  fdb_file_handle **ppfStack_d88;
  fdb_config *pfStack_d78;
  fdb_kvs_config *pfStack_d70;
  code *pcStack_d68;
  fdb_kvs_handle *pfStack_d50;
  fdb_file_handle *pfStack_d48;
  fdb_iterator *pfStack_d40;
  timeval tStack_d38;
  fdb_kvs_config fStack_d28;
  fdb_file_handle *apfStack_d10 [32];
  fdb_config fStack_c10;
  fdb_config fStack_b08;
  char acStack_a10 [264];
  fdb_config *pfStack_908;
  fdb_file_handle *pfStack_8d0;
  fdb_kvs_handle *pfStack_8c8;
  fdb_doc *pfStack_8c0;
  fdb_doc fStack_8b8;
  fdb_kvs_config fStack_868;
  timeval tStack_850;
  undefined1 auStack_840 [72];
  fdb_config fStack_7f8;
  char acStack_6f8 [256];
  fdb_config fStack_5f8;
  fdb_config *pfStack_500;
  fdb_doc *pfStack_4f8;
  fdb_doc *pfStack_4e0;
  fdb_kvs_handle *pfStack_4d8;
  fdb_file_handle *pfStack_4d0;
  fdb_doc *pfStack_4c8;
  undefined1 auStack_4c0 [88];
  fdb_kvs_config fStack_468;
  timeval tStack_450;
  uint8_t auStack_440 [256];
  fdb_config fStack_340;
  fdb_config fStack_240;
  fdb_config *pfStack_148;
  fdb_file_handle *local_130;
  fdb_kvs_handle *local_128;
  size_t local_120;
  int *local_118;
  timeval local_110;
  fdb_config local_100;
  
  gettimeofday(&local_110,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  local_100.buffercache_size = 0;
  local_100.num_compactor_threads = 1;
  fVar2 = fdb_open(&local_130,"./dummy3",&local_100);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open_default(local_130,&local_128,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011056d;
    fVar2 = fdb_begin_transaction(local_130,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110572;
    fVar2 = fdb_set_kv(local_128,"foo",3,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110577;
    fVar2 = fdb_end_transaction(local_130,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011057c;
    fVar2 = fdb_get_kv(local_128,"foo",3,&local_118,&local_120);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110581;
    if (local_120 != 5) {
      delete_reopen_test();
    }
    if ((char)local_118[1] != 'e' || *local_118 != 0x756c6176) goto LAB_00110586;
    fdb_free_block(local_118);
    fVar2 = fdb_begin_transaction(local_130,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011058b;
    fVar2 = fdb_del_kv(local_128,"foo",3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110590;
    fVar2 = fdb_end_transaction(local_130,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110595;
    fVar2 = fdb_get_kv(local_128,"foo",3,&local_118,&local_120);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011059a;
    fVar2 = fdb_close(local_130);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011059f;
    fVar2 = fdb_open(&local_130,"./dummy3",&local_100);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105a4;
    fVar2 = fdb_kvs_open_default(local_130,&local_128,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105a9;
    fVar2 = fdb_get_kv(local_128,"foo",3,&local_118,&local_120);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105ae;
    fVar2 = fdb_close(local_130);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (delete_reopen_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar6,"end trans delete & reopen passed");
      return;
    }
  }
  else {
    delete_reopen_test();
LAB_0011056d:
    delete_reopen_test();
LAB_00110572:
    delete_reopen_test();
LAB_00110577:
    delete_reopen_test();
LAB_0011057c:
    delete_reopen_test();
LAB_00110581:
    delete_reopen_test();
LAB_00110586:
    delete_reopen_test();
LAB_0011058b:
    delete_reopen_test();
LAB_00110590:
    delete_reopen_test();
LAB_00110595:
    delete_reopen_test();
LAB_0011059a:
    delete_reopen_test();
LAB_0011059f:
    delete_reopen_test();
LAB_001105a4:
    delete_reopen_test();
LAB_001105a9:
    delete_reopen_test();
LAB_001105ae:
    delete_reopen_test();
  }
  delete_reopen_test();
  pfStack_4f8 = (fdb_doc *)0x1105d1;
  pfStack_148 = &local_100;
  gettimeofday(&tStack_450,(__timezone_ptr_t)0x0);
  pfStack_4f8 = (fdb_doc *)0x1105d6;
  memleak_start();
  pfStack_4f8 = (fdb_doc *)0x1105e2;
  system("rm -rf  dummy* > errorlog.txt");
  auStack_4c0._72_8_ = (void *)0x0;
  auStack_4c0._0_8_ = 0;
  auStack_4c0._8_8_ = 0;
  auStack_4c0._16_8_ = 0;
  auStack_4c0._24_8_ = 0;
  auStack_4c0._48_8_ = 0;
  auStack_4c0._56_8_ = (fdb_compaction_callback)0x0;
  auStack_4c0._32_8_ = auStack_440;
  auStack_4c0._64_8_ = &fStack_340;
  auStack_4c0._40_8_ = 0xffffffffffffffff;
  pfVar4 = &fStack_240;
  pfStack_4f8 = (fdb_doc *)0x110631;
  fdb_get_default_config();
  fStack_240.purging_interval = 1;
  fStack_240.seqtree_opt = '\x01';
  pfStack_4f8 = (fdb_doc *)0x110649;
  fdb_get_default_kvs_config();
  pfStack_4f8 = (fdb_doc *)0x11065d;
  fVar2 = fdb_open(&pfStack_4d0,"./dummy1",pfVar4);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_4f8 = (fdb_doc *)0x11067e;
    fVar2 = fdb_kvs_open(pfStack_4d0,&pfStack_4d8,(char *)0x0,&fStack_468);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c7;
    builtin_memcpy(auStack_440,"key",4);
    pfVar4 = &fStack_340;
    fStack_340.chunksize = 0x6f62;
    fStack_340._2_2_ = 0x7964;
    fStack_340.blocksize._0_1_ = 0;
    pfStack_4f8 = (fdb_doc *)0x1106ab;
    auStack_4c0._0_8_ = strlen((char *)auStack_440);
    unaff_R14 = (fdb_doc *)auStack_4c0;
    pfStack_4f8 = (fdb_doc *)0x1106bb;
    auStack_4c0._16_8_ = strlen((char *)pfVar4);
    pfStack_4f8 = (fdb_doc *)0x1106cc;
    fVar2 = fdb_set(pfStack_4d8,unaff_R14);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108cc;
    pfStack_4f8 = (fdb_doc *)0x1106e3;
    fVar2 = fdb_commit(pfStack_4d0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d1;
    pfStack_4f8 = (fdb_doc *)0x1106fa;
    fVar2 = fdb_del(pfStack_4d8,(fdb_doc *)auStack_4c0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d6;
    pfStack_4f8 = (fdb_doc *)0x110711;
    fVar2 = fdb_commit(pfStack_4d0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108db;
    pfVar4 = (fdb_config *)&pfStack_4e0;
    pfStack_4f8 = (fdb_doc *)0x110743;
    fdb_doc_create((fdb_doc **)pfVar4,auStack_440,auStack_4c0._0_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_4f8 = (fdb_doc *)0x110750;
    fVar2 = fdb_get_metaonly(pfStack_4d8,pfStack_4e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e0;
    pfVar7 = pfStack_4e0;
    if (pfStack_4e0->deleted == false) {
      pfVar4 = (fdb_config *)&pfStack_4c8;
      pfStack_4f8 = (fdb_doc *)0x110775;
      deleted_doc_get_api_test();
      pfVar7 = pfStack_4c8;
    }
    pfVar7->deleted = false;
    pfStack_4f8 = (fdb_doc *)0x110786;
    fVar2 = fdb_get_metaonly_byseq(pfStack_4d8,pfVar7);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e5;
    pfVar7 = pfStack_4e0;
    if (pfStack_4e0->deleted == false) {
      pfVar4 = (fdb_config *)&pfStack_4c8;
      pfStack_4f8 = (fdb_doc *)0x1107ab;
      deleted_doc_get_api_test();
      pfVar7 = pfStack_4c8;
    }
    pfVar7->deleted = false;
    pfStack_4f8 = (fdb_doc *)0x1107bc;
    fVar2 = fdb_get_byoffset(pfStack_4d8,pfVar7);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ea;
    pfVar7 = pfStack_4e0;
    if (pfStack_4e0->deleted == false) {
      pfVar4 = (fdb_config *)&pfStack_4c8;
      pfStack_4f8 = (fdb_doc *)0x1107e2;
      deleted_doc_get_api_test();
      pfVar7 = pfStack_4c8;
    }
    pfVar7->deleted = false;
    pfStack_4f8 = (fdb_doc *)0x1107f3;
    fVar2 = fdb_get(pfStack_4d8,pfVar7);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ef;
    pfVar7 = pfStack_4e0;
    if (pfStack_4e0->deleted == true) {
      pfVar4 = (fdb_config *)&pfStack_4c8;
      pfStack_4f8 = (fdb_doc *)0x110819;
      deleted_doc_get_api_test();
      pfVar7 = pfStack_4c8;
    }
    pfVar7->deleted = false;
    pfStack_4f8 = (fdb_doc *)0x11082a;
    fVar2 = fdb_get_byseq(pfStack_4d8,pfVar7);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108f4;
    if (pfStack_4e0->deleted == true) {
      pfVar4 = (fdb_config *)&pfStack_4c8;
      pfStack_4f8 = (fdb_doc *)0x110850;
      deleted_doc_get_api_test();
      pfStack_4e0 = pfStack_4c8;
    }
    pfStack_4f8 = (fdb_doc *)0x110858;
    fdb_doc_free(pfStack_4e0);
    pfStack_4f8 = (fdb_doc *)0x110862;
    fVar2 = fdb_kvs_close(pfStack_4d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108f9;
    pfStack_4f8 = (fdb_doc *)0x110874;
    fVar2 = fdb_close(pfStack_4d0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_4f8 = (fdb_doc *)0x110881;
      fdb_shutdown();
      pfStack_4f8 = (fdb_doc *)0x110886;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (deleted_doc_get_api_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_4f8 = (fdb_doc *)0x1108b7;
      fprintf(_stderr,pcVar6,"deleted doc get api test");
      return;
    }
  }
  else {
    pfStack_4f8 = (fdb_doc *)0x1108c7;
    deleted_doc_get_api_test();
LAB_001108c7:
    pfStack_4f8 = (fdb_doc *)0x1108cc;
    deleted_doc_get_api_test();
LAB_001108cc:
    pfStack_4f8 = (fdb_doc *)0x1108d1;
    deleted_doc_get_api_test();
LAB_001108d1:
    pfStack_4f8 = (fdb_doc *)0x1108d6;
    deleted_doc_get_api_test();
LAB_001108d6:
    pfStack_4f8 = (fdb_doc *)0x1108db;
    deleted_doc_get_api_test();
LAB_001108db:
    pfStack_4f8 = (fdb_doc *)0x1108e0;
    deleted_doc_get_api_test();
LAB_001108e0:
    pfStack_4f8 = (fdb_doc *)0x1108e5;
    deleted_doc_get_api_test();
LAB_001108e5:
    pfStack_4f8 = (fdb_doc *)0x1108ea;
    deleted_doc_get_api_test();
LAB_001108ea:
    pfStack_4f8 = (fdb_doc *)0x1108ef;
    deleted_doc_get_api_test();
LAB_001108ef:
    pfStack_4f8 = (fdb_doc *)0x1108f4;
    deleted_doc_get_api_test();
LAB_001108f4:
    pfStack_4f8 = (fdb_doc *)0x1108f9;
    deleted_doc_get_api_test();
LAB_001108f9:
    pfStack_4f8 = (fdb_doc *)0x1108fe;
    deleted_doc_get_api_test();
  }
  pfStack_4f8 = (fdb_doc *)deleted_doc_stat_test;
  deleted_doc_get_api_test();
  pfStack_500 = pfVar4;
  pfStack_4f8 = unaff_R14;
  gettimeofday(&tStack_850,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fStack_8b8.size_ondisk = 0;
  fStack_8b8.meta = (void *)0x0;
  fStack_8b8.offset = 0;
  fStack_8b8.metalen = 0;
  fStack_8b8.bodylen = 0;
  fStack_8b8.deleted = false;
  fStack_8b8._73_3_ = 0;
  fStack_8b8.flags = 0;
  fStack_8b8.key = acStack_6f8;
  fStack_8b8.body = &fStack_7f8;
  fStack_8b8.seqnum = 0xffffffffffffffff;
  pfVar4 = &fStack_5f8;
  fdb_get_default_config();
  fStack_5f8.purging_interval = 0;
  fdb_get_default_kvs_config();
  fVar2 = fdb_open(&pfStack_8d0,"./dummy1",pfVar4);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open(pfStack_8d0,&pfStack_8c8,"main",&fStack_868);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b48;
    acStack_6f8[0] = 'K';
    acStack_6f8[1] = '\0';
    pfVar4 = &fStack_7f8;
    fStack_7f8.chunksize = 0x6f62;
    fStack_7f8._2_2_ = 0x7964;
    fStack_7f8.blocksize._0_1_ = 0;
    sVar3 = strlen(acStack_6f8);
    fStack_8b8.keylen = sVar3 + 1;
    sVar3 = strlen((char *)pfVar4);
    fStack_8b8.bodylen = sVar3 + 1;
    fVar2 = fdb_set(pfStack_8c8,&fStack_8b8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b4d;
    fVar2 = fdb_del(pfStack_8c8,&fStack_8b8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b52;
    pfVar4 = (fdb_config *)&pfStack_8c0;
    fdb_doc_create((fdb_doc **)pfVar4,fStack_8b8.key,fStack_8b8.keylen,(void *)0x0,0,(void *)0x0,0);
    fVar2 = fdb_get(pfStack_8c8,pfStack_8c0);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00110b57;
    fdb_doc_free(pfStack_8c0);
    fdb_get_file_info(pfStack_8d0,(fdb_file_info *)auStack_840);
    pfVar4 = (fdb_config *)(auStack_840 + 0x10);
    if (auStack_840._16_8_ != 0) {
      deleted_doc_stat_test();
    }
    fVar2 = fdb_commit(pfStack_8d0,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b5c;
    fdb_get_file_info(pfStack_8d0,(fdb_file_info *)auStack_840);
    if (auStack_840._16_8_ != 0) {
      deleted_doc_stat_test();
    }
    fVar2 = fdb_kvs_close(pfStack_8c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b61;
    fVar2 = fdb_close(pfStack_8d0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (deleted_doc_stat_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar6,"deleted doc stat test");
      return;
    }
  }
  else {
    deleted_doc_stat_test();
LAB_00110b48:
    deleted_doc_stat_test();
LAB_00110b4d:
    deleted_doc_stat_test();
LAB_00110b52:
    deleted_doc_stat_test();
LAB_00110b57:
    deleted_doc_stat_test();
LAB_00110b5c:
    deleted_doc_stat_test();
LAB_00110b61:
    deleted_doc_stat_test();
  }
  deleted_doc_stat_test();
  pcStack_d68 = (code *)0x110b88;
  pfStack_908 = pfVar4;
  gettimeofday(&tStack_d38,(__timezone_ptr_t)0x0);
  pcStack_d68 = (code *)0x110b8d;
  memleak_start();
  pcVar6 = acStack_a10;
  builtin_strncpy(acStack_a10,"./dummy1",9);
  pcStack_d68 = (code *)0x110bb2;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar4 = &fStack_b08;
  pcStack_d68 = (code *)0x110bc2;
  fdb_get_default_config();
  fStack_b08.buffercache_size = 0;
  kvs_config = &fStack_d28.create_if_missing;
  pcStack_d68 = (code *)0x110bd7;
  fdb_get_default_kvs_config();
  ptr_fhandle = &pfStack_d48;
  pcStack_d68 = (code *)0x110bea;
  fdb_open(ptr_fhandle,pcVar6,pfVar4);
  pcStack_d68 = (code *)0x110c02;
  fVar2 = fdb_kvs_open(pfStack_d48,&pfStack_d50,"db1",(fdb_kvs_config *)kvs_config);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d9c;
  unaff_RBP = 0;
  do {
    pcStack_d68 = (code *)0x110c33;
    sprintf((char *)&fStack_c10,"key%05d",unaff_RBP);
    pcStack_d68 = (code *)0x110c42;
    sprintf((char *)apfStack_d10,"value%05d",unaff_RBP);
    pfVar1 = pfStack_d50;
    pcStack_d68 = (code *)0x110c4f;
    sVar3 = strlen((char *)&fStack_c10);
    pcVar6 = (char *)(sVar3 + 1);
    pcStack_d68 = (code *)0x110c5b;
    sVar3 = strlen((char *)apfStack_d10);
    pcStack_d68 = (code *)0x110c70;
    fVar2 = fdb_set_kv(pfVar1,&fStack_c10,(size_t)pcVar6,apfStack_d10,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_d68 = (code *)0x110d97;
      complete_delete_test();
      goto LAB_00110d97;
    }
    uVar5 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar5;
  } while (uVar5 != 1000);
  pcStack_d68 = (code *)0x110c91;
  fdb_commit(pfStack_d48,'\x01');
  pcVar6 = "key%05d";
  pfVar4 = &fStack_c10;
  kvs_config = "value%05d";
  ptr_fhandle = apfStack_d10;
  unaff_RBP = 0;
  do {
    pcStack_d68 = (code *)0x110cbd;
    sprintf((char *)pfVar4,"key%05d",unaff_RBP);
    pcStack_d68 = (code *)0x110ccc;
    sprintf((char *)ptr_fhandle,"value%05d",unaff_RBP);
    pfVar1 = pfStack_d50;
    pcStack_d68 = (code *)0x110cd9;
    sVar3 = strlen((char *)pfVar4);
    pcStack_d68 = (code *)0x110ce8;
    fVar2 = fdb_del_kv(pfVar1,pfVar4,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d97;
    uVar5 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar5;
  } while (uVar5 != 1000);
  pcStack_d68 = (code *)0x110d09;
  fdb_commit(pfStack_d48,'\x01');
  pcStack_d68 = (code *)0x110d29;
  fVar2 = fdb_iterator_init(pfStack_d50,&pfStack_d40,(void *)0x0,0,(void *)0x0,0,2);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110da1;
  pcStack_d68 = (code *)0x110d37;
  fVar2 = fdb_iterator_close(pfStack_d40);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_d68 = (code *)0x110d45;
    fdb_close(pfStack_d48);
    pcStack_d68 = (code *)0x110d4a;
    fdb_shutdown();
    pcStack_d68 = (code *)0x110d4f;
    memleak_end();
    pcVar6 = "%s PASSED\n";
    if (complete_delete_test()::__test_pass != '\0') {
      pcVar6 = "%s FAILED\n";
    }
    pcStack_d68 = (code *)0x110d80;
    fprintf(_stderr,pcVar6,"complete delete");
    return;
  }
  goto LAB_00110da6;
LAB_00110d97:
  pfVar4 = &fStack_c10;
  ptr_fhandle = apfStack_d10;
  kvs_config = "value%05d";
  pcStack_d68 = (code *)0x110d9c;
  complete_delete_test();
LAB_00110d9c:
  pcStack_d68 = (code *)0x110da1;
  complete_delete_test();
LAB_00110da1:
  pcStack_d68 = (code *)0x110da6;
  complete_delete_test();
LAB_00110da6:
  pcStack_d68 = large_batch_write_no_commit_test;
  complete_delete_test();
  pfStack_11e0 = (fdb_config *)0x110dc8;
  pcStack_d90 = pcVar6;
  ppfStack_d88 = ptr_fhandle;
  pfStack_d78 = pfVar4;
  pfStack_d70 = (fdb_kvs_config *)kvs_config;
  pcStack_d68 = (code *)unaff_RBP;
  gettimeofday(&tStack_11a8,(__timezone_ptr_t)0x0);
  pfStack_11e0 = (fdb_config *)0x110dcd;
  memleak_start();
  pfStack_11e0 = (fdb_config *)0x110dd7;
  __ptr = (fdb_config *)malloc(4000000);
  pfStack_11e0 = (fdb_config *)0x110de6;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar4 = &fStack_1090;
  pfStack_11e0 = (fdb_config *)0x110df6;
  fdb_get_default_config();
  pfStack_11e0 = (fdb_config *)0x110e00;
  fdb_get_default_kvs_config();
  pfStack_11e0 = (fdb_config *)0x110e14;
  fVar2 = fdb_open(&pfStack_11d0,"./dummy1",pfVar4);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_11e0 = (fdb_config *)0x110e32;
    fVar2 = fdb_kvs_open(pfStack_11d0,&pfStack_11c8,(char *)0x0,&fStack_11c0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb7;
    pcVar6 = (char *)0x0;
    uVar8 = 0;
    do {
      pfStack_11e0 = (fdb_config *)0x110e5b;
      sprintf(acStack_e98,"key%128d",uVar8 & 0xffffffff);
      pfStack_11e0 = (fdb_config *)0x110e77;
      sprintf(acStack_f98,"meta%128d",uVar8 & 0xffffffff);
      pfStack_11e0 = (fdb_config *)0x110e8d;
      sprintf(acStack_1198,"body%128d",uVar8 & 0xffffffff);
      pfStack_11e0 = (fdb_config *)0x110e99;
      sVar3 = strlen(acStack_e98);
      pfStack_11e0 = (fdb_config *)0x110ea7;
      metalen = strlen(acStack_f98);
      pfStack_11e0 = (fdb_config *)0x110eb4;
      bodylen = strlen(acStack_1198);
      pfStack_11e0 = (fdb_config *)0x110ede;
      fdb_doc_create((fdb_doc **)(pcVar6 + (long)&__ptr->chunksize),acStack_e98,sVar3,acStack_f98,
                     metalen,acStack_1198,bodylen);
      pfStack_11e0 = (fdb_config *)0x110eec;
      fdb_set(pfStack_11c8,*(fdb_doc **)(&__ptr->chunksize + uVar8 * 4));
      pfStack_11e0 = (fdb_config *)0x110ef5;
      fdb_doc_free(*(fdb_doc **)(&__ptr->chunksize + uVar8 * 4));
      uVar8 = uVar8 + 1;
      pcVar6 = pcVar6 + 8;
    } while (uVar8 != 500000);
    pfStack_11e0 = (fdb_config *)0x110f13;
    fVar2 = fdb_kvs_close(pfStack_11c8);
    pfVar4 = __ptr;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fbc;
    pfStack_11e0 = (fdb_config *)0x110f25;
    fVar2 = fdb_close(pfStack_11d0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fc1;
    pfStack_11e0 = (fdb_config *)0x110f46;
    fVar2 = fdb_open(&pfStack_11d0,"./dummy1",&fStack_1090);
    if (fVar2 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f5d:
      pfStack_11e0 = (fdb_config *)0x110f65;
      free(__ptr);
      pfStack_11e0 = (fdb_config *)0x110f6a;
      fdb_shutdown();
      pfStack_11e0 = (fdb_config *)0x110f6f;
      memleak_end();
      pcVar6 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar6 = "%s FAILED\n";
      }
      pfStack_11e0 = (fdb_config *)0x110fa0;
      fprintf(_stderr,pcVar6,"large batch write test with no commits");
      return;
    }
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_11e0 = (fdb_config *)0x110f59;
      fVar2 = fdb_close(pfStack_11d0);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      goto LAB_00110fcb;
    }
  }
  else {
    pfStack_11e0 = (fdb_config *)0x110fb7;
    large_batch_write_no_commit_test();
LAB_00110fb7:
    pfStack_11e0 = (fdb_config *)0x110fbc;
    large_batch_write_no_commit_test();
LAB_00110fbc:
    pfStack_11e0 = (fdb_config *)0x110fc1;
    large_batch_write_no_commit_test();
LAB_00110fc1:
    pfStack_11e0 = (fdb_config *)0x110fc6;
    large_batch_write_no_commit_test();
  }
  pfStack_11e0 = (fdb_config *)0x110fcb;
  large_batch_write_no_commit_test();
LAB_00110fcb:
  pfStack_11e0 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  pcStack_11f0 = pcVar6;
  pfStack_11e8 = pfVar4;
  pfStack_11e0 = __ptr;
  gettimeofday(&tStack_1410,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_13e8.wal_threshold = 0x400;
  fStack_13e8.seqtree_opt = '\x01';
  fStack_13e8.purging_interval = 1;
  fStack_13e8.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_1418,"./dummy1",&fStack_13e8);
  fdb_kvs_open(pfStack_1418,&pfStack_1420,"db1",&fStack_1400);
  sprintf(acStack_12f0,"key%d",0);
  sVar3 = strlen(acStack_12f0);
  fdb_doc_create(&pfStack_1428,acStack_12f0,sVar3,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_1420,pfStack_1428);
  fVar2 = fdb_get(pfStack_1420,pfStack_1428);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar2 = fdb_get_byoffset(pfStack_1420,pfStack_1428);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_get_metaonly(pfStack_1420,pfStack_1428);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_get_metaonly_byseq(pfStack_1420,pfStack_1428);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_1420,pfStack_1428);
        fVar2 = fdb_get(pfStack_1420,pfStack_1428);
        if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_1428->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar2 = fdb_get_metaonly(pfStack_1420,pfStack_1428);
          if (fVar2 == FDB_RESULT_SUCCESS) {
            if (pfStack_1428->deleted == false) {
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x354,"void set_get_meta_test()");
            }
            fVar2 = fdb_get_metaonly_byseq(pfStack_1420,pfStack_1428);
            if (fVar2 == FDB_RESULT_SUCCESS) {
              if (pfStack_1428->deleted != false) {
                fVar2 = fdb_get_byoffset(pfStack_1420,pfStack_1428);
                if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
                  if (pfStack_1428->deleted != false) {
                    fdb_doc_free(pfStack_1428);
                    fdb_kvs_close(pfStack_1420);
                    fdb_close(pfStack_1418);
                    fdb_shutdown();
                    memleak_end();
                    pcVar6 = "%s PASSED\n";
                    if (set_get_meta_test()::__test_pass != '\0') {
                      pcVar6 = "%s FAILED\n";
                    }
                    fprintf(_stderr,pcVar6,"set get meta test");
                    return;
                  }
                }
                else {
                  set_get_meta_test();
                }
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x35c,"void set_get_meta_test()");
              }
            }
            else {
              set_get_meta_test();
            }
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x358,"void set_get_meta_test()");
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x353,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void delete_reopen_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    fdb_file_handle *fh;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size = 0;
    fconfig.num_compactor_threads = 1;
    status = fdb_open(&fh, "./dummy3", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_open_default(fh, &db, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_begin_transaction(fh, FDB_ISOLATION_READ_COMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_kv(db, (void *) "foo", 3, (void *)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_end_transaction(fh, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    void *value;
    size_t valueSize;
    status = fdb_get_kv(db, (void*)"foo", 3, &value, &valueSize);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CHK(valueSize == 5);
    TEST_CMP(value, "value", 5);
    fdb_free_block(value);

    status = fdb_begin_transaction(fh, FDB_ISOLATION_READ_COMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_del_kv(db, "foo", 3);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_end_transaction(fh, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kv(db, "foo", 3, &value, &valueSize);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    status = fdb_close(fh);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Reopen:
    status = fdb_open(&fh, "./dummy3", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_open_default(fh, &db, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kv(db, "foo", 3, &value, &valueSize);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    status = fdb_close(fh);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("end trans delete & reopen passed");
}